

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O1

void ftghbn_(int *A1,int *A2,int *A3,int *A4,char *A5,char *A6,char *A7,char *A8,int *A9,int *A10,
            size_t C5,size_t C6,size_t C7,size_t C8)

{
  char **ttype;
  char *pcVar1;
  char **tform;
  char **tunit;
  char *s;
  size_t sVar2;
  uint uVar3;
  unsigned_long uVar4;
  size_t sVar5;
  int nelem;
  ulong uVar6;
  uint celem_len;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long B3;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  fitsfile *local_60;
  int *local_58;
  int *local_50;
  char *local_48;
  long B9;
  long tfields;
  
  local_60 = gFitsFiles[*A1];
  uVar3 = *A2;
  lVar9 = (long)(int)uVar3;
  uVar8 = 0;
  local_58 = A4;
  ffgkyj(local_60,"TFIELDS",&tfields,(char *)0x0,A10);
  if (tfields < lVar9) {
    uVar3 = (uint)tfields;
  }
  uVar10 = tfields & 0xffffffff;
  if (-1 < lVar9) {
    uVar10 = (ulong)uVar3;
  }
  iVar7 = (int)uVar10;
  uVar6 = 1;
  if (1 < iVar7) {
    uVar6 = uVar10;
  }
  uVar4 = C5;
  if (C5 < gMinStrLen) {
    uVar4 = gMinStrLen;
  }
  B3 = (long)*A3;
  uVar3 = (int)uVar4 + 1;
  local_50 = A3;
  ttype = (char **)malloc(uVar6 * 8);
  nelem = (int)uVar6;
  pcVar1 = (char *)malloc((ulong)(uVar3 * nelem));
  *ttype = pcVar1;
  local_48 = A5;
  pcVar1 = f2cstrv2(A5,pcVar1,(int)C5,uVar3,nelem);
  do {
    ttype[uVar8] = pcVar1;
    uVar8 = uVar8 + 1;
    pcVar1 = pcVar1 + (int)uVar3;
  } while (uVar6 != uVar8);
  uVar8 = 1;
  if (1 < iVar7) {
    uVar8 = uVar10;
  }
  uVar4 = C6;
  if (C6 < gMinStrLen) {
    uVar4 = gMinStrLen;
  }
  celem_len = (int)uVar4 + 1;
  local_68 = (ulong)uVar3;
  tform = (char **)malloc(uVar8 * 8);
  pcVar1 = (char *)malloc((ulong)(celem_len * (int)uVar8));
  *tform = pcVar1;
  local_78 = uVar8;
  pcVar1 = f2cstrv2(A6,pcVar1,(int)C6,celem_len,(int)uVar8);
  uVar8 = 0;
  do {
    tform[uVar8] = pcVar1;
    uVar8 = uVar8 + 1;
    pcVar1 = pcVar1 + (int)celem_len;
  } while (uVar6 != uVar8);
  uVar8 = 1;
  if (1 < iVar7) {
    uVar8 = uVar10;
  }
  uVar4 = C7;
  if (C7 < gMinStrLen) {
    uVar4 = gMinStrLen;
  }
  uVar3 = (int)uVar4 + 1;
  local_80 = (ulong)celem_len;
  local_70 = uVar10;
  tunit = (char **)malloc(uVar8 * 8);
  iVar7 = (int)uVar8;
  pcVar1 = (char *)malloc((ulong)(uVar3 * iVar7));
  *tunit = pcVar1;
  pcVar1 = f2cstrv2(A7,pcVar1,(int)C7,uVar3,iVar7);
  uVar10 = 0;
  do {
    tunit[uVar10] = pcVar1;
    uVar10 = uVar10 + 1;
    pcVar1 = pcVar1 + (int)uVar3;
  } while (uVar8 != uVar10);
  sVar5 = gMinStrLen;
  if (gMinStrLen <= C8) {
    sVar5 = C8;
  }
  local_88 = (ulong)uVar3;
  s = (char *)malloc(sVar5 + 1);
  s[C8] = '\0';
  pcVar1 = A8;
  memcpy(s,A8,C8);
  kill_trailing(s,(char)pcVar1);
  B9 = (long)*A9;
  ffghbn(local_60,(int)local_70,&B3,local_58,ttype,tform,tunit,s,&B9,A10);
  *local_50 = (int)B3;
  c2fstrv2(*ttype,local_48,(int)local_68,(int)C5,nelem);
  free(*ttype);
  free(ttype);
  c2fstrv2(*tform,A6,(int)local_80,(int)C6,(int)local_78);
  free(*tform);
  free(tform);
  c2fstrv2(*tunit,A7,(int)local_88,(int)C7,iVar7);
  free(*tunit);
  free(tunit);
  if (s != (char *)0x0) {
    sVar2 = strlen(s);
    if (C8 <= sVar2) {
      sVar2 = C8;
    }
    memcpy(A8,s,sVar2);
    sVar2 = strlen(s);
    if (sVar2 <= C8 && C8 - sVar2 != 0) {
      memset(A8 + sVar2,0x20,C8 - sVar2);
    }
    free(s);
  }
  *A9 = (int)B9;
  return;
}

Assistant:

CFextern VOID_cfF(FTGHBN,ftghbn)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,INT,PLONG,PINT,PSTRINGV,PSTRINGV,PSTRINGV,PSTRING,PLONG,PINT,CF_0,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(INT,2)
   QCF(PLONG,3)
   QCF(PINT,4)
   QCF(PSTRINGV,5)
   QCF(PSTRINGV,6)
   QCF(PSTRINGV,7)
   QCF(PSTRING,8)
   QCF(PLONG,9)
   QCF(PINT,10)

   fitsfile *fptr;
   long tfields;
   int maxdim,*status;

   fptr = TCF(ftghbn,FITSUNIT,1,0);
   status =  TCF(ftghbn,PINT,10,0);
   maxdim =  TCF(ftghbn,INT,2,0);
   ffgkyj( fptr, "TFIELDS", &tfields, 0, status );
   maxdim = (maxdim<0) ? tfields : _cfMIN(tfields,maxdim);

   ffghbn(   fptr, maxdim
             TCF(ftghbn,PLONG,3,1)
             TCF(ftghbn,PINT,4,1)
             TCF(ftghbn,PSTRINGV,5,1)
             TCF(ftghbn,PSTRINGV,6,1)
             TCF(ftghbn,PSTRINGV,7,1)
             TCF(ftghbn,PSTRING,8,1)
             TCF(ftghbn,PLONG,9,1)
             , status );

   RCF(FITSUNIT,1)
   RCF(INT,2)
   RCF(PLONG,3)
   RCF(PINT,4)
   RCF(PSTRINGV,5)
   RCF(PSTRINGV,6)
   RCF(PSTRINGV,7)
   RCF(PSTRING,8)
   RCF(PLONG,9)
   RCF(PINT,10)
}